

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O3

DWORD ConvertBytesToInteger_4(LPBYTE ValueAsBytes)

{
  uint uVar1;
  
  uVar1 = *(uint *)ValueAsBytes;
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

DWORD ConvertBytesToInteger_4(LPBYTE ValueAsBytes)
{
    DWORD Value = 0;

    Value = (Value << 0x08) | ValueAsBytes[0];
    Value = (Value << 0x08) | ValueAsBytes[1];
    Value = (Value << 0x08) | ValueAsBytes[2];
    Value = (Value << 0x08) | ValueAsBytes[3];

    return Value;
}